

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_la.cxx
# Opt level: O3

void __thiscall xray_re::se_safe::state_read(se_safe *this,xr_packet *packet,uint16_t size)

{
  uchar value;
  uchar value_1;
  unsigned_short value_2;
  char local_1c;
  char local_1b;
  uint16_t local_1a;
  
  cse_alife_object_physic::state_read(&this->super_cse_alife_object_physic,packet,size);
  xr_packet::r_raw(packet,&local_1c,1);
  this->m_init_items_spawned = local_1c != '\0';
  xr_packet::r_raw(packet,&local_1b,1);
  this->m_safe_locked = local_1b != '\0';
  xr_packet::r_raw(packet,&local_1a,2);
  this->m_count = local_1a;
  if (local_1a == 0) {
    return;
  }
  __assert_fail("m_count == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_la.cxx"
                ,0x1a,"virtual void xray_re::se_safe::state_read(xr_packet &, uint16_t)");
}

Assistant:

void se_safe::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_object_physic::state_read(packet, size);
	m_init_items_spawned = packet.r_bool();
	m_safe_locked = packet.r_bool();
	m_count = packet.r_u16();
	xr_assert(m_count == 0);
}